

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanLogicalDevice.cpp
# Opt level: O0

BufferViewWrapper * __thiscall
VulkanUtilities::VulkanLogicalDevice::CreateBufferView
          (BufferViewWrapper *__return_storage_ptr__,VulkanLogicalDevice *this,
          VkBufferViewCreateInfo *BuffViewCI,char *DebugName)

{
  Char *Message;
  undefined1 local_48 [8];
  string msg;
  char *DebugName_local;
  VkBufferViewCreateInfo *BuffViewCI_local;
  VulkanLogicalDevice *this_local;
  
  msg.field_2._8_8_ = DebugName;
  if (BuffViewCI->sType != VK_STRUCTURE_TYPE_BUFFER_VIEW_CREATE_INFO) {
    Diligent::FormatString<char[26],char[62]>
              ((string *)local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"BuffViewCI.sType == VK_STRUCTURE_TYPE_BUFFER_VIEW_CREATE_INFO",
               (char (*) [62])DebugName);
    Message = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (Message,"CreateBufferView",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanLogicalDevice.cpp"
               ,0xc6);
    std::__cxx11::string::~string((string *)local_48);
  }
  CreateVulkanObject<VkBufferView_T*,(VulkanUtilities::VulkanHandleTypeId)3,VkResult(*)(VkDevice_T*,VkBufferViewCreateInfo_const*,VkAllocationCallbacks_const*,VkBufferView_T**),VkBufferViewCreateInfo>
            (__return_storage_ptr__,this,
             (_func_VkResult_VkDevice_T_ptr_VkBufferViewCreateInfo_ptr_VkAllocationCallbacks_ptr_VkBufferView_T_ptr_ptr
              *)vkCreateBufferView,BuffViewCI,(char *)msg.field_2._8_8_,"buffer view");
  return __return_storage_ptr__;
}

Assistant:

BufferViewWrapper VulkanLogicalDevice::CreateBufferView(const VkBufferViewCreateInfo& BuffViewCI,
                                                        const char*                   DebugName) const
{
    VERIFY_EXPR(BuffViewCI.sType == VK_STRUCTURE_TYPE_BUFFER_VIEW_CREATE_INFO);
    return CreateVulkanObject<VkBufferView, VulkanHandleTypeId::BufferView>(vkCreateBufferView, BuffViewCI, DebugName, "buffer view");
}